

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-dos.cc
# Opt level: O3

void __thiscall
DataSourceDOS::SpriteDosSolid::SpriteDosSolid(SpriteDosSolid *this,PBuffer *_data,ColorDOS *palette)

{
  byte bVar1;
  uchar value;
  uchar value_00;
  element_type *peVar2;
  byte *pbVar3;
  bool bVar4;
  uint8_t *puVar5;
  ExceptionFreeserf *this_00;
  PMutableBuffer result;
  undefined1 local_61;
  string local_60;
  PBuffer local_40;
  EndianessMode local_2c;
  
  local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi)->_M_use_count + 1;
    }
  }
  SpriteBaseDOS::SpriteBaseDOS(&this->super_SpriteBaseDOS,&local_40);
  if (local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  (this->super_SpriteBaseDOS).super_SpriteBase.super_Sprite._vptr_Sprite =
       (_func_int **)&PTR_get_data_00156e38;
  if (((_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->size ==
      (this->super_SpriteBaseDOS).super_SpriteBase.height *
      (this->super_SpriteBaseDOS).super_SpriteBase.width + 10) {
    local_2c = EndianessBig;
    std::__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<MutableBuffer>,Buffer::EndianessMode>
              ((__shared_ptr<MutableBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_60,
               (allocator<MutableBuffer> *)&local_61,&local_2c);
    while( true ) {
      bVar4 = Buffer::readable((_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr);
      if (!bVar4) break;
      peVar2 = (_data->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pbVar3 = peVar2->read;
      bVar1 = *pbVar3;
      peVar2->read = pbVar3 + 1;
      value = palette[bVar1].r;
      value_00 = palette[bVar1].g;
      MutableBuffer::push<unsigned_char>
                ((MutableBuffer *)local_60._M_dataplus._M_p,palette[bVar1].b,1);
      MutableBuffer::push<unsigned_char>((MutableBuffer *)local_60._M_dataplus._M_p,value_00,1);
      MutableBuffer::push<unsigned_char>((MutableBuffer *)local_60._M_dataplus._M_p,value,1);
      MutableBuffer::push<unsigned_char>((MutableBuffer *)local_60._M_dataplus._M_p,0xff,1);
    }
    puVar5 = (uint8_t *)MutableBuffer::unfix((MutableBuffer *)local_60._M_dataplus._M_p);
    (this->super_SpriteBaseDOS).super_SpriteBase.data = puVar5;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._M_string_length);
    }
    return;
  }
  this_00 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"Failed to extract DOS solid sprite","");
  ExceptionFreeserf::ExceptionFreeserf(this_00,&local_60);
  __cxa_throw(this_00,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

DataSourceDOS::SpriteDosSolid::SpriteDosSolid(PBuffer _data, ColorDOS *palette)
  : SpriteBaseDOS(_data) {
  size_t size = _data->get_size();
  if (size != (width * height + 10)) {
    throw ExceptionFreeserf("Failed to extract DOS solid sprite");
  }

  PMutableBuffer result = std::make_shared<MutableBuffer>(Buffer::EndianessBig);

  while (_data->readable()) {
    ColorDOS color = palette[_data->pop<uint8_t>()];
    result->push<uint8_t>(color.b);  // Blue
    result->push<uint8_t>(color.g);  // Green
    result->push<uint8_t>(color.r);  // Red
    result->push<uint8_t>(0xff);     // Alpha
  }

  data = reinterpret_cast<uint8_t*>(result->unfix());
}